

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_graph.cc
# Opt level: O3

string * __thiscall
InputGraph::vertex_name_abi_cxx11_(string *__return_storage_ptr__,InputGraph *this,int v)

{
  left_map lVar1;
  long lVar2;
  uint uVar3;
  undefined4 in_EAX;
  iterator iVar4;
  uint uVar5;
  ulong uVar6;
  string *__str;
  uint __val;
  undefined8 in_R8;
  undefined8 in_R9;
  uint __len;
  
  lVar1.super_unordered_map_adaptor<_d10c590c_>.
  super_unordered_associative_container_adaptor<_ddf44b9e_>.super_type.super_type.dwfb.data =
       ((left_map *)
       ((long)&((this->_imp)._M_t.
                super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>._M_t.
                super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>.
                super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl)->vertex_names + 0x98))
       ->super_unordered_map_adaptor<_d10c590c_>;
  iVar4 = boost::multi_index::detail::
          hashed_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,true>,int,&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,true>::left>,boost::hash<int>,std::equal_to<int>,boost::multi_index::detail::nth_layer<2,boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,boost::hash<int>,std::equal_to<int>>,boost::bimaps::unordered_set_of<std::__cxx11::string,boost::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,boost::container::allocator<std::pair<int,std::__cxx11::string>,2u,0u>,mpl_::na,mpl_::na>::core_indices,boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,2u,0u>>,boost::mpl::v_item<boost::bimaps::relation::member_at::left,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
          ::find<int,boost::hash<int>,std::equal_to<int>>
                    ((hashed_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,true>,int,&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,true>::left>,boost::hash<int>,std::equal_to<int>,boost::multi_index::detail::nth_layer<2,boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,boost::hash<int>,std::equal_to<int>>,boost::bimaps::unordered_set_of<std::__cxx11::string,boost::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,boost::container::allocator<std::pair<int,std::__cxx11::string>,2u,0u>,mpl_::na,mpl_::na>::core_indices,boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,2u,0u>>,boost::mpl::v_item<boost::bimaps::relation::member_at::left,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
                      *)lVar1.super_unordered_map_adaptor<_d10c590c_>.
                        super_unordered_associative_container_adaptor<_ddf44b9e_>.super_type.
                        super_type.dwfb.data,&stack0xffffffffffffffdc,
                     (hashed_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,true>,int,&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,true>::left>,boost::hash<int>,std::equal_to<int>,boost::multi_index::detail::nth_layer<2,boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,boost::hash<int>,std::equal_to<int>>,boost::bimaps::unordered_set_of<std::__cxx11::string,boost::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,boost::container::allocator<std::pair<int,std::__cxx11::string>,2u,0u>,mpl_::na,mpl_::na>::core_indices,boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,2u,0u>>,boost::mpl::v_item<boost::bimaps::relation::member_at::left,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
                      *)((long)lVar1.super_unordered_map_adaptor<_d10c590c_>.
                               super_unordered_associative_container_adaptor<_ddf44b9e_>.super_type.
                               super_type.dwfb.data + 1),
                     (hashed_index<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,true>,int,&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,true>::left>,boost::hash<int>,std::equal_to<int>,boost::multi_index::detail::nth_layer<2,boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,boost::bimaps::detail::bimap_core<boost::bimaps::unordered_set_of<int,boost::hash<int>,std::equal_to<int>>,boost::bimaps::unordered_set_of<std::__cxx11::string,boost::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>>,boost::container::allocator<std::pair<int,std::__cxx11::string>,2u,0u>,mpl_::na,mpl_::na>::core_indices,boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<int_const,boost::bimaps::relation::member_at::left>,boost::bimaps::tags::tagged<std::__cxx11::string_const,boost::bimaps::relation::member_at::right>,mpl_::na,true>,2u,0u>>,boost::mpl::v_item<boost::bimaps::relation::member_at::left,boost::mpl::vector0<mpl_::na>,0>,boost::multi_index::detail::hashed_unique_tag>
                      *)((long)lVar1.super_unordered_map_adaptor<_d10c590c_>.
                               super_unordered_associative_container_adaptor<_ddf44b9e_>.super_type.
                               super_type.dwfb.data + 2),in_R8,in_R9,CONCAT44(v,in_EAX));
  if (iVar4.node ==
      *(hashed_index_node<boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_2U,_0U>_>_>
        **)((long)((left_map *)
                  ((long)&((this->_imp)._M_t.
                           super___uniq_ptr_impl<InputGraph::Imp,_std::default_delete<InputGraph::Imp>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_InputGraph::Imp_*,_std::default_delete<InputGraph::Imp>_>
                           .super__Head_base<0UL,_InputGraph::Imp_*,_false>._M_head_impl)->
                          vertex_names + 0x98))->super_unordered_map_adaptor<_d10c590c_> + -8)) {
    __len = 1;
    __val = -v;
    if (0 < v) {
      __val = v;
    }
    if (9 < __val) {
      uVar6 = (ulong)__val;
      uVar3 = 4;
      do {
        __len = uVar3;
        uVar5 = (uint)uVar6;
        if (uVar5 < 100) {
          __len = __len - 2;
          goto LAB_001517c6;
        }
        if (uVar5 < 1000) {
          __len = __len - 1;
          goto LAB_001517c6;
        }
        if (uVar5 < 10000) goto LAB_001517c6;
        uVar6 = uVar6 / 10000;
        uVar3 = __len + 4;
      } while (99999 < uVar5);
      __len = __len + 1;
    }
LAB_001517c6:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (__return_storage_ptr__,(ulong)(__len + -(v >> 0x1f)),'-');
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((__return_storage_ptr__->_M_dataplus)._M_p + (uint)-(v >> 0x1f),__len,__val);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar2 = *(long *)((long)&((iVar4.node)->
                             super_index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_2U,_0U>_>
                             ).
                             super_pod_value_holder<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
                             .space.data_ + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar2,
               *(long *)((long)&((iVar4.node)->
                                super_index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::container::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_2U,_0U>_>
                                ).
                                super_pod_value_holder<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
                                .space.data_ + 0x10) + lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

auto InputGraph::vertex_name(int v) const -> string
{
    auto it = _imp->vertex_names.left.find(v);
    if (it == _imp->vertex_names.left.end())
        return to_string(v);
    else
        return it->second;
}